

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

HighsDebugStatus __thiscall HSimplexNla::debugCheckData(HSimplexNla *this,string *message)

{
  long lVar1;
  bool bVar2;
  HighsInt HVar3;
  HighsInt *pHVar4;
  HighsInt *pHVar5;
  double *pdVar6;
  int *piVar7;
  int *piVar8;
  double *pdVar9;
  HighsLogOptions *pHVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  reference pvVar13;
  reference pvVar14;
  long in_RDI;
  HighsInt iEl_1;
  HighsInt iEl;
  HighsInt error_el;
  HighsInt nnz;
  HighsInt iCol;
  HighsInt error_col;
  double *factor_Avalue;
  HighsInt *factor_Aindex;
  HighsInt *factor_Astart;
  bool error_found;
  bool error2_found;
  bool error1_found;
  bool error0_found;
  HighsLp check_lp;
  string scale_status;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  HighsInt in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  HighsLp *in_stack_fffffffffffffb40;
  HighsLp *in_stack_fffffffffffffb88;
  HighsLp *in_stack_fffffffffffffb90;
  uint local_41c;
  uint local_418;
  uint local_414;
  uint local_40c;
  uint local_408;
  int local_3e0;
  vector<int,_std::allocator<int>_> local_350 [2];
  vector<int,_std::allocator<int>_> local_320;
  vector<double,_std::allocator<double>_> local_308 [30];
  string local_38 [52];
  HighsDebugStatus local_4;
  
  std::__cxx11::string::string(local_38);
  if (*(long *)(in_RDI + 8) == 0) {
    std::__cxx11::string::operator=(local_38,"NULL");
  }
  else {
    std::__cxx11::string::operator=(local_38,"non-NULL");
  }
  HighsLp::HighsLp(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  pHVar4 = HFactor::getAstart((HFactor *)(in_RDI + 0x30));
  pHVar5 = HFactor::getAindex((HFactor *)(in_RDI + 0x30));
  pdVar6 = HFactor::getAvalue((HFactor *)(in_RDI + 0x30));
  if (*(long *)(in_RDI + 8) == 0) {
    piVar7 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7be27d);
    piVar8 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7be2e8);
    pdVar9 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x7be32b);
    bVar2 = true;
    if ((pHVar4 == piVar7) && (bVar2 = true, pHVar5 == piVar8)) {
      bVar2 = pdVar6 != pdVar9;
    }
    if (bVar2) {
      pHVar10 = (HighsLogOptions *)(*(long *)(in_RDI + 0x18) + 0x380);
      uVar11 = std::__cxx11::string::c_str();
      uVar12 = std::__cxx11::string::c_str();
      highsLogUser(pHVar10,kError,
                   "CheckNlaData: (%s) scale_ is %s lp_ - factor_ matrix pointer errors\n",uVar11,
                   uVar12);
      if (pHVar4 != piVar7) {
        piVar7 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x7be427);
        printf("a_matrix_.start_ pointer error: %p vs %p\n",pHVar4,piVar7);
      }
      if (pHVar5 != piVar8) {
        printf("a_matrix_.index pointer error\n");
      }
      if (pdVar6 != pdVar9) {
        printf("a_matrix_.value pointer error\n");
      }
      local_4 = kLogicalError;
      goto LAB_007be8e7;
    }
  }
  else {
    HighsLp::applyScale(in_stack_fffffffffffffb40);
  }
  local_408 = 0xffffffff;
  for (local_40c = 0; (int)local_40c < local_3e0 + 1; local_40c = local_40c + 1) {
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](local_350,(long)(int)local_40c);
    if (*pvVar13 != pHVar4[(int)local_40c]) {
      local_408 = local_40c;
      break;
    }
  }
  if ((int)local_408 < 0) {
    HVar3 = HighsSparseMatrix::numNz
                      ((HighsSparseMatrix *)
                       CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    local_414 = 0xffffffff;
    for (local_418 = 0; (int)local_418 < HVar3; local_418 = local_418 + 1) {
      pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_320,(long)(int)local_418);
      if (*pvVar13 != pHVar5[(int)local_418]) {
        local_414 = local_418;
        break;
      }
    }
    if ((int)local_414 < 0) {
      for (local_41c = 0; (int)local_41c < HVar3; local_41c = local_41c + 1) {
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            (local_308,(long)(int)local_41c);
        if ((*pvVar14 != pdVar6[(int)local_41c]) || (NAN(*pvVar14) || NAN(pdVar6[(int)local_41c])))
        {
          local_414 = local_41c;
          break;
        }
      }
      if ((int)local_414 < 0) {
        local_4 = kOk;
      }
      else {
        lVar1 = *(long *)(in_RDI + 0x18);
        uVar11 = std::__cxx11::string::c_str();
        uVar12 = std::__cxx11::string::c_str();
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            (local_308,(long)(int)local_414);
        highsLogUser((HighsLogOptions *)*pvVar14,(HighsLogType)pdVar6[(int)local_414],
                     (char *)(lVar1 + 0x380),5,
                     "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.value_ != factor_Avalue for el %d (%g != %g)\n"
                     ,uVar11,uVar12,(ulong)local_414);
        local_4 = kLogicalError;
      }
    }
    else {
      pHVar10 = (HighsLogOptions *)(*(long *)(in_RDI + 0x18) + 0x380);
      uVar11 = std::__cxx11::string::c_str();
      uVar12 = std::__cxx11::string::c_str();
      pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_320,(long)(int)local_414);
      in_stack_fffffffffffffb10 = pHVar5[(int)local_414];
      highsLogUser(pHVar10,kError,
                   "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.index_ != factor_Aindex for el %d (%d != %d)\n"
                   ,uVar11,uVar12,(ulong)local_414,*pvVar13);
      local_4 = kLogicalError;
    }
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x18);
    uVar11 = std::__cxx11::string::c_str();
    uVar12 = std::__cxx11::string::c_str();
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](local_350,(long)(int)local_408);
    in_stack_fffffffffffffb10 = pHVar4[(int)local_408];
    highsLogUser((HighsLogOptions *)(lVar1 + 0x380),kError,
                 "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.start_ != factor_Astart for col %d (%d != %d)\n"
                 ,uVar11,uVar12,(ulong)local_408,*pvVar13);
    local_4 = kLogicalError;
  }
LAB_007be8e7:
  HighsLp::~HighsLp((HighsLp *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

HighsDebugStatus HSimplexNla::debugCheckData(const std::string message) const {
  std::string scale_status;
  if (scale_ == NULL) {
    scale_status = "NULL";
  } else {
    scale_status = "non-NULL";
  }
  //  if (options_->highs_debug_level < kHighsDebugLevelCheap) return
  //  HighsDebugStatus::kOk;
  HighsLp check_lp = *lp_;
  bool error0_found = false;
  bool error1_found = false;
  bool error2_found = false;
  bool error_found = false;
  const HighsInt* factor_Astart = factor_.getAstart();
  const HighsInt* factor_Aindex = factor_.getAindex();
  const double* factor_Avalue = factor_.getAvalue();

  if (scale_ == NULL) {
    if (factor_Astart != lp_->a_matrix_.start_.data()) error0_found = true;
    if (factor_Aindex != lp_->a_matrix_.index_.data()) error1_found = true;
    if (factor_Avalue != lp_->a_matrix_.value_.data()) error2_found = true;
    error_found = error0_found || error1_found || error2_found;
    if (error_found) {
      highsLogUser(options_->log_options, HighsLogType::kError,
                   "CheckNlaData: (%s) scale_ is %s lp_ - factor_ matrix "
                   "pointer errors\n",
                   message.c_str(), scale_status.c_str());
      if (error0_found)
        printf("a_matrix_.start_ pointer error: %p vs %p\n",
               (void*)factor_Astart, (void*)lp_->a_matrix_.start_.data());
      if (error1_found) printf("a_matrix_.index pointer error\n");
      if (error2_found) printf("a_matrix_.value pointer error\n");
      assert(!error_found);
      return HighsDebugStatus::kLogicalError;
    }
  } else {
    check_lp.applyScale();
  }
  HighsInt error_col = -1;
  for (HighsInt iCol = 0; iCol < check_lp.num_col_ + 1; iCol++) {
    if (check_lp.a_matrix_.start_[iCol] != factor_Astart[iCol]) {
      error_col = iCol;
      break;
    }
  }
  error_found = error_col >= 0;
  if (error_found) {
    highsLogUser(options_->log_options, HighsLogType::kError,
                 "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.start_ != "
                 "factor_Astart for col %d (%d != %d)\n",
                 message.c_str(), scale_status.c_str(), (int)error_col,
                 (int)check_lp.a_matrix_.start_[error_col],
                 (int)factor_Astart[error_col]);
    assert(!error_found);
    return HighsDebugStatus::kLogicalError;
  }
  HighsInt nnz = check_lp.a_matrix_.numNz();
  HighsInt error_el = -1;
  for (HighsInt iEl = 0; iEl < nnz; iEl++) {
    if (check_lp.a_matrix_.index_[iEl] != factor_Aindex[iEl]) {
      error_el = iEl;
      break;
    }
  }
  error_found = error_el >= 0;
  if (error_found) {
    highsLogUser(options_->log_options, HighsLogType::kError,
                 "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.index_ != "
                 "factor_Aindex for el %d (%d != %d)\n",
                 message.c_str(), scale_status.c_str(), (int)error_el,
                 (int)check_lp.a_matrix_.index_[error_el],
                 (int)factor_Aindex[error_el]);
    assert(!error_found);
    return HighsDebugStatus::kLogicalError;
  }
  for (HighsInt iEl = 0; iEl < nnz; iEl++) {
    if (check_lp.a_matrix_.value_[iEl] != factor_Avalue[iEl]) {
      error_el = iEl;
      break;
    }
  }
  error_found = error_el >= 0;
  if (error_found) {
    highsLogUser(options_->log_options, HighsLogType::kError,
                 "CheckNlaData: (%s) scale_ is %s check_lp.a_matrix_.value_ != "
                 "factor_Avalue for el %d (%g != %g)\n",
                 message.c_str(), scale_status.c_str(), (int)error_el,
                 check_lp.a_matrix_.value_[error_el], factor_Avalue[error_el]);
    assert(!error_found);
    return HighsDebugStatus::kLogicalError;
  }
  return HighsDebugStatus::kOk;
}